

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O0

void __thiscall duckdb::StringAggBindData::~StringAggBindData(StringAggBindData *this)

{
  StringAggBindData *in_RDI;
  
  ~StringAggBindData(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit StringAggBindData(string sep_p) : sep(std::move(sep_p)) {
	}